

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclInvalidConstructors2<glcts::ArraysOfArrays::Interface::ES>
           *this,TestShaderType tested_shader_type)

{
  TestError *this_00;
  long lVar1;
  allocator<char> local_13e;
  allocator<char> local_13d;
  allocator<char> local_13c;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  string shader_source;
  string invalid_initializers [7];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_initializers,"    int x[2][2][0]; \n",
             (allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers + 1),"    int x[2][0][2]; \n",&local_139);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers + 2),"    int x[0][2][2]; \n",&local_13a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers + 3),"    int x[2][0][0]; \n",&local_13b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers + 4),"    int x[0][2][0]; \n",&local_13c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers + 5),"    int x[0][0][2]; \n",&local_13d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_initializers + 6),"    int x[0][0][0]; \n",&local_13e);
  lVar1 = 0;
  do {
    if (lVar1 == 0xe0) {
      lVar1 = 0xc0;
      do {
        std::__cxx11::string::~string
                  ((string *)((long)&invalid_initializers[0]._M_dataplus._M_p + lVar1));
        lVar1 = lVar1 + -0x20;
      } while (lVar1 != -0x20);
      return;
    }
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    shader_source._M_string_length = 0;
    shader_source.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&shader_source);
    std::__cxx11::string::append((string *)&shader_source);
    switch((ulong)tested_shader_type) {
    case 0:
    case 2:
    case 5:
      break;
    case 1:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case 4:
    case 3:
      std::__cxx11::string::append((string *)&shader_source);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x8ae);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::append((string *)&shader_source);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
    std::__cxx11::string::~string((string *)&shader_source);
    lVar1 = lVar1 + 0x20;
  } while( true );
}

Assistant:

void ConstructorsAndUnsizedDeclInvalidConstructors2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string invalid_initializers[] = { "    int x[2][2][0]; \n", "    int x[2][0][2]; \n", "    int x[0][2][2]; \n",
										   "    int x[2][0][0]; \n", "    int x[0][2][0]; \n", "    int x[0][0][2]; \n",
										   "    int x[0][0][0]; \n" };

	for (size_t invalid_initializers_index = 0;
		 invalid_initializers_index < sizeof(invalid_initializers) / sizeof(invalid_initializers[0]);
		 invalid_initializers_index++)
	{
		std::string shader_source;

		shader_source = shader_start;
		shader_source += invalid_initializers[invalid_initializers_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int invalid_initializers_index = 0; ...) */
}